

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O2

int mbedtls_cmac_self_test(int verbose)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uchar (*pauVar4) [16];
  size_t *psVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  int in_stack_ffffffffffffffc0;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  iVar2 = cmac_test_subkeys(verbose,"AES 128",aes_128_key,0x80,aes_128_subkeys[0],
                            MBEDTLS_CIPHER_AES_128_ECB,0x10,in_stack_ffffffffffffffb0);
  if (iVar2 == 0) {
    iVar3 = 0x10;
    iVar2 = cmac_test_wth_cipher
                      (verbose,"AES 128",aes_128_key,0x80,(uchar *)aes_message_lengths,
                       (uint *)aes_128_expected_result,(uchar *)0x2,MBEDTLS_CIPHER_AES_256_GCM,
                       in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
    if ((iVar2 == 0) &&
       (iVar2 = cmac_test_subkeys(verbose,"AES 192",aes_192_key,0xc0,aes_192_subkeys[0],
                                  MBEDTLS_CIPHER_AES_192_ECB,0x10,iVar3), iVar2 == 0)) {
      iVar3 = 0x10;
      iVar2 = cmac_test_wth_cipher
                        (verbose,"AES 192",aes_192_key,0xc0,(uchar *)aes_message_lengths,
                         (uint *)aes_192_expected_result,(uchar *)0x3,MBEDTLS_CIPHER_AES_256_GCM,
                         in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
      if ((iVar2 == 0) &&
         (iVar2 = cmac_test_subkeys(verbose,"AES 256",aes_256_key,0x100,aes_256_subkeys[0],
                                    MBEDTLS_CIPHER_AES_256_ECB,0x10,iVar3), iVar2 == 0)) {
        iVar3 = 0x10;
        iVar2 = cmac_test_wth_cipher
                          (verbose,"AES 256",aes_256_key,0x100,(uchar *)aes_message_lengths,
                           (uint *)aes_256_expected_result,(uchar *)0x4,MBEDTLS_CIPHER_AES_256_GCM,
                           in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
        if ((iVar2 == 0) &&
           (iVar2 = cmac_test_subkeys(verbose,"3DES 2 key",des3_2key_key,0xc0,des3_2key_subkeys[0],
                                      MBEDTLS_CIPHER_DES_EDE3_ECB,8,iVar3), iVar2 == 0)) {
          iVar3 = 8;
          iVar2 = cmac_test_wth_cipher
                            (verbose,"3DES 2 key",des3_2key_key,0xc0,(uchar *)des3_message_lengths,
                             (uint *)des3_2key_expected_result,(uchar *)0x24,
                             MBEDTLS_CIPHER_AES_128_CFB128,in_stack_ffffffffffffffb8,
                             in_stack_ffffffffffffffc0);
          if ((iVar2 == 0) &&
             (iVar2 = cmac_test_subkeys(verbose,"3DES 3 key",des3_3key_key,0xc0,des3_3key_subkeys[0]
                                        ,MBEDTLS_CIPHER_DES_EDE3_ECB,8,iVar3), iVar2 == 0)) {
            iVar2 = cmac_test_wth_cipher
                              (verbose,"3DES 3 key",des3_3key_key,0xc0,(uchar *)des3_message_lengths
                               ,(uint *)des3_3key_expected_result,(uchar *)0x24,
                               MBEDTLS_CIPHER_AES_128_CFB128,in_stack_ffffffffffffffb8,
                               in_stack_ffffffffffffffc0);
            if (iVar2 == 0) {
              iVar3 = -0x6e;
              bVar1 = true;
              pauVar4 = PRFT;
              psVar5 = PRFKlen;
              for (uVar6 = 0; uVar6 != 3; uVar6 = uVar6 + 1) {
                printf("  AES CMAC 128 PRF #%u: ",uVar6 & 0xffffffff);
                iVar2 = mbedtls_aes_cmac_prf_128("",*psVar5,"",0x14,&stack0xffffffffffffffb8);
                if (iVar2 != 0) {
                  if (verbose == 0) {
                    return iVar2;
                  }
LAB_00123715:
                  puts("failed");
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                  goto LAB_00123729;
                }
                auVar7[0] = -((*pauVar4)[0] == (uchar)in_stack_ffffffffffffffb8);
                auVar7[1] = -((*pauVar4)[1] == (uchar)((uint)in_stack_ffffffffffffffb8 >> 8));
                auVar7[2] = -((*pauVar4)[2] == (uchar)((uint)in_stack_ffffffffffffffb8 >> 0x10));
                auVar7[3] = -((*pauVar4)[3] == (uchar)((uint)in_stack_ffffffffffffffb8 >> 0x18));
                auVar7[4] = -((*pauVar4)[4] == uStack_44);
                auVar7[5] = -((*pauVar4)[5] == uStack_43);
                auVar7[6] = -((*pauVar4)[6] == uStack_42);
                auVar7[7] = -((*pauVar4)[7] == uStack_41);
                auVar7[8] = -((*pauVar4)[8] == (uchar)in_stack_ffffffffffffffc0);
                auVar7[9] = -((*pauVar4)[9] == (uchar)((uint)in_stack_ffffffffffffffc0 >> 8));
                auVar7[10] = -((*pauVar4)[10] == (uchar)((uint)in_stack_ffffffffffffffc0 >> 0x10));
                auVar7[0xb] = -((*pauVar4)[0xb] == (uchar)((uint)in_stack_ffffffffffffffc0 >> 0x18))
                ;
                auVar7[0xc] = -((*pauVar4)[0xc] == uStack_3c);
                auVar7[0xd] = -((*pauVar4)[0xd] == uStack_3b);
                auVar7[0xe] = -((*pauVar4)[0xe] == uStack_3a);
                auVar7[0xf] = -((*pauVar4)[0xf] == uStack_39);
                if ((ushort)((ushort)(SUB161(auVar7 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar7 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar7 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar7 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar7 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar7 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar7 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar7 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar7 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar7 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar7 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar7 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar7 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar7 >> 0x77,0) & 1) << 0xe |
                            (ushort)(auVar7[0xf] >> 7) << 0xf) != 0xffff) {
                  if (verbose != 0) goto LAB_00123715;
                  goto LAB_00123731;
                }
                if (verbose != 0) {
                  puts("passed");
                }
                pauVar4 = pauVar4 + 1;
                psVar5 = psVar5 + 1;
                bVar1 = false;
                iVar3 = 0;
              }
              iVar2 = 0;
              if (bVar1) {
                iVar2 = iVar3;
              }
              if (verbose != 0 && !bVar1) {
LAB_00123729:
                putchar(10);
LAB_00123731:
                iVar2 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_cmac_self_test( int verbose )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

#if defined(MBEDTLS_AES_C)
    /* AES-128 */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "AES 128",
                                   aes_128_key,
                                   128,
                                   (const unsigned char*)aes_128_subkeys,
                                   MBEDTLS_CIPHER_AES_128_ECB,
                                   MBEDTLS_AES_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher( verbose,
                                      "AES 128",
                                      aes_128_key,
                                      128,
                                      test_message,
                                      aes_message_lengths,
                                      (const unsigned char*)aes_128_expected_result,
                                      MBEDTLS_CIPHER_AES_128_ECB,
                                      MBEDTLS_AES_BLOCK_SIZE,
                                      NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    /* AES-192 */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "AES 192",
                                   aes_192_key,
                                   192,
                                   (const unsigned char*)aes_192_subkeys,
                                   MBEDTLS_CIPHER_AES_192_ECB,
                                   MBEDTLS_AES_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher( verbose,
                                      "AES 192",
                                      aes_192_key,
                                      192,
                                      test_message,
                                      aes_message_lengths,
                                      (const unsigned char*)aes_192_expected_result,
                                      MBEDTLS_CIPHER_AES_192_ECB,
                                      MBEDTLS_AES_BLOCK_SIZE,
                                      NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    /* AES-256 */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "AES 256",
                                   aes_256_key,
                                   256,
                                   (const unsigned char*)aes_256_subkeys,
                                   MBEDTLS_CIPHER_AES_256_ECB,
                                   MBEDTLS_AES_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher ( verbose,
                                       "AES 256",
                                       aes_256_key,
                                       256,
                                       test_message,
                                       aes_message_lengths,
                                       (const unsigned char*)aes_256_expected_result,
                                       MBEDTLS_CIPHER_AES_256_ECB,
                                       MBEDTLS_AES_BLOCK_SIZE,
                                       NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }
#endif /* MBEDTLS_AES_C */

#if defined(MBEDTLS_DES_C)
    /* 3DES 2 key */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "3DES 2 key",
                                   des3_2key_key,
                                   192,
                                   (const unsigned char*)des3_2key_subkeys,
                                   MBEDTLS_CIPHER_DES_EDE3_ECB,
                                   MBEDTLS_DES3_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher( verbose,
                                      "3DES 2 key",
                                      des3_2key_key,
                                      192,
                                      test_message,
                                      des3_message_lengths,
                                      (const unsigned char*)des3_2key_expected_result,
                                      MBEDTLS_CIPHER_DES_EDE3_ECB,
                                      MBEDTLS_DES3_BLOCK_SIZE,
                                      NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    /* 3DES 3 key */
    if( ( ret = cmac_test_subkeys( verbose,
                                   "3DES 3 key",
                                   des3_3key_key,
                                   192,
                                   (const unsigned char*)des3_3key_subkeys,
                                   MBEDTLS_CIPHER_DES_EDE3_ECB,
                                   MBEDTLS_DES3_BLOCK_SIZE,
                                   NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }

    if( ( ret = cmac_test_wth_cipher( verbose,
                                      "3DES 3 key",
                                      des3_3key_key,
                                      192,
                                      test_message,
                                      des3_message_lengths,
                                      (const unsigned char*)des3_3key_expected_result,
                                      MBEDTLS_CIPHER_DES_EDE3_ECB,
                                      MBEDTLS_DES3_BLOCK_SIZE,
                                      NB_CMAC_TESTS_PER_KEY ) ) != 0 )
    {
        return( ret );
    }
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_AES_C)
    if( ( ret = test_aes128_cmac_prf( verbose ) ) != 0 )
        return( ret );
#endif /* MBEDTLS_AES_C */

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );
}